

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_random_long_trailing_delim_Test<char8_t>::TestBody
          (SplitStringTest_random_long_trailing_delim_Test<char8_t> *this)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_100 [8];
  Message local_f8 [8];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_b8;
  undefined1 local_98 [8];
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  data;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> delim;
  SplitStringTest_random_long_trailing_delim_Test<char8_t> *this_local;
  
  __return_storage_ptr__ =
       &data.m_tokens.
        super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  make_delim_long<char8_t,std::__cxx11::u8string>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             __return_storage_ptr__,8,'\0');
  std::__cxx11::u8string::u8string
            ((u8string *)&local_b8,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             __return_storage_ptr__);
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::RandomTestData((RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                    *)local_98,&local_b8,0,0);
  std::__cxx11::u8string::~u8string((u8string *)&local_b8);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator+=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_fixed_word_length,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_tokens.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::emplace_back<>((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                    *)((long)&data.m_str.field_2 + 8));
  jessilib::
  split<std::vector,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((container_type *)&gtest_ar.message_,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_fixed_word_length,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_tokens.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::
  Compare<std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_f0,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar.message_,
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)((long)&data.m_str.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)&gtest_ar.message_);
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::~RandomTestData((RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                     *)local_98);
  std::__cxx11::u8string::~u8string
            ((u8string *)
             &data.m_tokens.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_trailing_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str += delim;
	data.m_tokens.emplace_back();
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}